

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::EmbeddingNDLayerParams::MergeFrom
          (EmbeddingNDLayerParams *this,EmbeddingNDLayerParams *from)

{
  ulong uVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x63eb);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  puVar3 = (undefined1 *)from->weights_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (EmbeddingNDLayerParams *)_EmbeddingNDLayerParams_default_instance_) {
    pWVar2 = this->weights_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->weights_ = pWVar2;
      puVar3 = (undefined1 *)from->weights_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->bias_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (EmbeddingNDLayerParams *)_EmbeddingNDLayerParams_default_instance_) {
    pWVar2 = this->bias_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->bias_ = pWVar2;
      puVar3 = (undefined1 *)from->bias_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  if (from->vocabsize_ != 0) {
    this->vocabsize_ = from->vocabsize_;
  }
  if (from->embeddingsize_ != 0) {
    this->embeddingsize_ = from->embeddingsize_;
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void EmbeddingNDLayerParams::MergeFrom(const EmbeddingNDLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.EmbeddingNDLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_weights()) {
    _internal_mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_weights());
  }
  if (from._internal_has_bias()) {
    _internal_mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_bias());
  }
  if (from._internal_vocabsize() != 0) {
    _internal_set_vocabsize(from._internal_vocabsize());
  }
  if (from._internal_embeddingsize() != 0) {
    _internal_set_embeddingsize(from._internal_embeddingsize());
  }
  if (from._internal_hasbias() != 0) {
    _internal_set_hasbias(from._internal_hasbias());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}